

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O2

TestCase *
deqp::gls::TextureStateQueryTests::createIsTextureTest
          (TestContext *testCtx,RenderContext *renderCtx,string *name,string *description,
          GLenum target)

{
  TestCase *this;
  
  this = (TestCase *)operator_new(0x80);
  tcu::TestCase::TestCase(this,testCtx,(name->_M_dataplus)._M_p,(description->_M_dataplus)._M_p);
  (this->super_TestNode)._vptr_TestNode = (_func_int **)&PTR__TestCase_01e6e398;
  this[1].super_TestNode._vptr_TestNode = (_func_int **)renderCtx;
  *(GLenum *)&this[1].super_TestNode.m_testCtx = target;
  return this;
}

Assistant:

tcu::TestCase* createIsTextureTest (tcu::TestContext& testCtx, const glu::RenderContext& renderCtx, const std::string& name, const std::string& description, glw::GLenum target)
{
	return new IsTextureCase(testCtx, renderCtx, name.c_str(), description.c_str(), target);
}